

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  byte bVar1;
  ushort uVar2;
  BCReg BVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  uint uVar6;
  BCReg BVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint8_t local_138 [264];
  
  uVar6 = pc[1] >> 8 & 0xff;
  iVar8 = (pc[1] >> 0x10) - 0x8000;
  if (cond == 0) {
    iVar8 = 0;
  }
  uVar9 = (int)pc + 8 + iVar8 * 4;
  pSVar4 = (J->cur).snap;
  uVar11 = (ulong)(J->cur).nsnap;
  uVar2 = pSVar4[uVar11 - 1].mapofs;
  bVar1 = pSVar4[uVar11 - 1].nent;
  uVar14 = (ulong)bVar1;
  pSVar5 = (J->cur).snapmap;
  pSVar5[uVar2 + uVar14] = uVar9;
  J->needsnap = '\x01';
  uVar13 = J->maxslot;
  if (uVar6 < J->maxslot) {
    J->maxslot = uVar6;
    uVar9 = pSVar5[uVar2 + uVar14];
    uVar13 = uVar6;
  }
  BVar7 = snap_usedef(J,local_138,(BCIns *)(ulong)uVar9,uVar13);
  BVar3 = J->baseslot;
  pSVar4[uVar11 - 1].nslots = (uint8_t)(uVar13 + BVar3);
  if (uVar14 == 0) {
    uVar6 = ~(uint)uVar2 + (uint)(J->cur).nsnapmap;
    uVar9 = 0;
  }
  else {
    uVar10 = 0;
    uVar9 = 0;
    do {
      uVar6 = pSVar5[uVar2 + uVar10] >> 0x18;
      if ((uVar6 < BVar7 + BVar3) ||
         ((uVar6 < uVar13 + BVar3 && (local_138[uVar6 - BVar3] == '\0')))) {
        uVar12 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        pSVar5[uVar2 + uVar12] = pSVar5[uVar2 + uVar10];
      }
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
    pSVar4[uVar11 - 1].nent = (uint8_t)uVar9;
    uVar6 = ~(uint)uVar2 + (uint)(J->cur).nsnapmap;
    if (uVar6 < bVar1) goto LAB_0012e982;
  }
  do {
    uVar13 = (int)uVar14 + 1;
    uVar11 = (ulong)uVar9;
    uVar9 = uVar9 + 1;
    pSVar5[uVar2 + uVar11] = pSVar5[uVar2 + uVar14];
    uVar14 = (ulong)uVar13;
  } while (uVar13 <= uVar6);
LAB_0012e982:
  (J->cur).nsnapmap = uVar2 + (short)uVar9;
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}